

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O0

ChebyshevExpansion * __thiscall
ChebTools::ChebyshevExpansion::operator+=(ChebyshevExpansion *this,ChebyshevExpansion *donor)

{
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_00;
  unsigned_long *puVar1;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pDVar2;
  Type local_118;
  Type local_e0;
  Type local_a8;
  Type local_70;
  unsigned_long local_38;
  size_t Nmax;
  size_t Nmin;
  size_t N1;
  size_t Ndonor;
  ChebyshevExpansion *donor_local;
  ChebyshevExpansion *this_local;
  
  Ndonor = (size_t)donor;
  donor_local = this;
  this_00 = (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)coef(donor);
  N1 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size(this_00);
  Nmin = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                   ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
  puVar1 = std::min<unsigned_long>(&Nmin,&N1);
  Nmax = *puVar1;
  puVar1 = std::max<unsigned_long>(&Nmin,&N1);
  local_38 = *puVar1;
  pDVar2 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)coef((ChebyshevExpansion *)Ndonor);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<unsigned_long>
            (&local_70,pDVar2,Nmax);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<unsigned_long>
            (&local_a8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,Nmax);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)&local_a8,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
              *)&local_70);
  if (Nmin < N1) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,N1);
    pDVar2 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             coef((ChebyshevExpansion *)Ndonor);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::tail<unsigned_long>
              (&local_e0,pDVar2,local_38 - Nmax);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::tail<unsigned_long>
              (&local_118,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,local_38 - Nmax
              );
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_118,
               (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                *)&local_e0);
  }
  return this;
}

Assistant:

ChebyshevExpansion& ChebyshevExpansion::operator+=(const ChebyshevExpansion &donor) {
        std::size_t Ndonor = donor.coef().size(), N1 = m_c.size();
        std::size_t Nmin = std::min(N1, Ndonor), Nmax = std::max(N1, Ndonor);
        // The first Nmin terms overlap between the two vectors
        m_c.head(Nmin) += donor.coef().head(Nmin);
        // If the donor vector is longer than the current vector, resizing is needed
        if (Ndonor > N1) {
            // Resize but leave values as they were
            m_c.conservativeResize(Ndonor);
            // Copy the last Nmax-Nmin values from the donor
            m_c.tail(Nmax - Nmin) = donor.coef().tail(Nmax - Nmin);
        }
        return *this;
    }